

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O3

CpuSet * ncnn::get_cpu_thread_affinity_mask(int powersave)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  FILE *pFVar4;
  CpuSet *pCVar5;
  long lVar6;
  ulong uVar7;
  undefined8 *puVar8;
  undefined8 *puVar9;
  int iVar10;
  ulong uVar11;
  byte bVar12;
  int freq_khz;
  vector<int,_std::allocator<int>_> cpu_max_freq_khz;
  char path [256];
  int local_160;
  uint local_15c;
  int local_158;
  int local_154;
  vector<int,_std::allocator<int>_> local_150;
  allocator_type local_138 [264];
  
  bVar12 = 0;
  _DAT_005a7330 = 0;
  uRam00000000005a7338 = 0;
  _DAT_005a7320 = 0;
  uRam00000000005a7328 = 0;
  _DAT_005a7310 = 0;
  uRam00000000005a7318 = 0;
  _DAT_005a7300 = 0;
  uRam00000000005a7308 = 0;
  _DAT_005a72f0 = 0;
  uRam00000000005a72f8 = 0;
  _DAT_005a72e0 = 0;
  uRam00000000005a72e8 = 0;
  _DAT_005a72d0 = 0;
  uRam00000000005a72d8 = 0;
  g_thread_affinity_mask_all = 0;
  DAT_005a72c8 = 0;
  std::vector<int,_std::allocator<int>_>::vector(&local_150,(long)(int)g_cpucount,local_138);
  if ((int)g_cpucount < 1) {
    iVar2 = 0x7fffffff;
    iVar1 = 0;
  }
  else {
    iVar2 = 0x7fffffff;
    uVar11 = 0;
    iVar1 = 0;
    local_15c = powersave;
    do {
      local_158 = iVar1;
      local_154 = iVar2;
      sprintf((char *)local_138,"/sys/devices/system/cpu/cpufreq/stats/cpu%d/time_in_state",
              uVar11 & 0xffffffff);
      pFVar4 = fopen((char *)local_138,"rb");
      if (pFVar4 == (FILE *)0x0) {
        sprintf((char *)local_138,"/sys/devices/system/cpu/cpu%d/cpufreq/stats/time_in_state",
                uVar11 & 0xffffffff);
        pFVar4 = fopen((char *)local_138,"rb");
        if (pFVar4 != (FILE *)0x0) {
          iVar1 = 0;
          do {
            iVar10 = iVar1;
            iVar1 = feof(pFVar4);
            if (iVar1 != 0) break;
            local_160 = 0;
            iVar2 = __isoc99_fscanf(pFVar4,"%d %*d",&local_160);
            iVar1 = local_160;
            if (local_160 <= iVar10) {
              iVar1 = iVar10;
            }
          } while (iVar2 == 1);
          fclose(pFVar4);
          if (iVar10 != 0) goto LAB_0016aab1;
        }
        sprintf((char *)local_138,"/sys/devices/system/cpu/cpu%d/cpufreq/cpuinfo_max_freq",
                uVar11 & 0xffffffff);
        pFVar4 = fopen((char *)local_138,"rb");
        if (pFVar4 == (FILE *)0x0) {
          iVar10 = -1;
        }
        else {
          local_160 = -1;
          uVar3 = __isoc99_fscanf(pFVar4,"%d",&local_160);
          if (uVar3 != 1) {
            get_cpu_thread_affinity_mask((ncnn *)(ulong)uVar3);
          }
          fclose(pFVar4);
          iVar10 = local_160;
        }
      }
      else {
        iVar1 = 0;
        do {
          iVar10 = iVar1;
          iVar1 = feof(pFVar4);
          if (iVar1 != 0) break;
          local_160 = 0;
          iVar2 = __isoc99_fscanf(pFVar4,"%d %*d",&local_160);
          iVar1 = local_160;
          if (local_160 <= iVar10) {
            iVar1 = iVar10;
          }
        } while (iVar2 == 1);
        fclose(pFVar4);
      }
LAB_0016aab1:
      iVar1 = local_158;
      if (local_158 < iVar10) {
        iVar1 = iVar10;
      }
      iVar2 = local_154;
      if (iVar10 < local_154) {
        iVar2 = iVar10;
      }
      local_150.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar11] = iVar10;
      uVar11 = uVar11 + 1;
      powersave = local_15c;
    } while ((long)uVar11 < (long)(int)g_cpucount);
  }
  iVar2 = (iVar2 + iVar1) / 2;
  if (iVar2 == iVar1) {
    _DAT_005a73b0 = 0;
    uRam00000000005a73b8 = 0;
    _DAT_005a73a0 = 0;
    uRam00000000005a73a8 = 0;
    _DAT_005a7390 = 0;
    uRam00000000005a7398 = 0;
    _DAT_005a7380 = 0;
    uRam00000000005a7388 = 0;
    _DAT_005a7370 = 0;
    uRam00000000005a7378 = 0;
    _DAT_005a7360 = 0;
    uRam00000000005a7368 = 0;
    _DAT_005a7350 = 0;
    uRam00000000005a7358 = 0;
    g_thread_affinity_mask_little = 0;
    uRam00000000005a7348 = 0;
    puVar9 = &g_thread_affinity_mask_all;
    puVar8 = &g_thread_affinity_mask_big;
    for (lVar6 = 0x10; lVar6 != 0; lVar6 = lVar6 + -1) {
      *puVar8 = *puVar9;
      puVar9 = puVar9 + (ulong)bVar12 * -2 + 1;
      puVar8 = puVar8 + (ulong)bVar12 * -2 + 1;
    }
LAB_0016ac9c:
    if (local_150.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start == (pointer)0x0) goto LAB_0016acae;
  }
  else {
    if ((int)g_cpucount < 1) goto LAB_0016ac9c;
    uVar7 = (ulong)g_cpucount;
    uVar11 = 0;
    do {
      if (uVar11 < 0x400) {
        puVar9 = &g_thread_affinity_mask_big;
        if (local_150.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar11] < iVar2) {
          puVar9 = &g_thread_affinity_mask_little;
        }
        puVar9[uVar11 >> 6] = puVar9[uVar11 >> 6] | 1L << ((byte)uVar11 & 0x3f);
      }
      uVar11 = uVar11 + 1;
    } while (uVar7 != uVar11);
  }
  operator_delete(local_150.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  (long)local_150.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage -
                  (long)local_150.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
LAB_0016acae:
  if ((uint)powersave < 3) {
    pCVar5 = (CpuSet *)(&PTR_g_thread_affinity_mask_all_00579518)[(uint)powersave];
  }
  else {
    get_cpu_thread_affinity_mask((ncnn *)(ulong)(uint)powersave);
    pCVar5 = (CpuSet *)&g_thread_affinity_mask_all;
  }
  return pCVar5;
}

Assistant:

const CpuSet& get_cpu_thread_affinity_mask(int powersave)
{
    setup_thread_affinity_masks();

    if (powersave == 0)
        return g_thread_affinity_mask_all;

    if (powersave == 1)
        return g_thread_affinity_mask_little;

    if (powersave == 2)
        return g_thread_affinity_mask_big;

    NCNN_LOGE("powersave %d not supported", powersave);

    // fallback to all cores anyway
    return g_thread_affinity_mask_all;
}